

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_bailingmoe::llm_build_bailingmoe
          (llm_build_bailingmoe *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  ggml_context *pgVar1;
  ggml_tensor *pgVar2;
  llm_graph_input_attn_kv_unified *gf_00;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  const_reference pvVar5;
  ggml_tensor *pgVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ggml_backend_buffer *name;
  ggml_tensor *gate;
  pointer plVar9;
  ggml_tensor *pgVar10;
  undefined8 in_RCX;
  long in_RSI;
  llm_graph_context *in_RDI;
  ggml_tensor *ffn_shexp;
  ggml_tensor *moe_out;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *rope_factors;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  ggml_tensor *in_stack_fffffffffffffd48;
  int iVar11;
  int iVar12;
  llm_graph_context *in_stack_fffffffffffffd50;
  ggml_backend_buffer *pgVar13;
  ggml_tensor *in_stack_fffffffffffffd58;
  ggml_tensor *pgVar14;
  ggml_tensor *in_stack_fffffffffffffd60;
  llm_graph_context *this_00;
  ggml_tensor *in_stack_fffffffffffffd68;
  undefined4 uVar16;
  ggml_tensor *pgVar15;
  llm_graph_context *in_stack_fffffffffffffd70;
  ggml_tensor *in_stack_fffffffffffffda0;
  ggml_tensor *in_stack_fffffffffffffda8;
  ggml_tensor *in_stack_fffffffffffffdb0;
  ggml_tensor *in_stack_fffffffffffffde8;
  ggml_tensor *in_stack_fffffffffffffdf0;
  ggml_tensor *pgVar17;
  ggml_tensor *in_stack_fffffffffffffe18;
  ggml_tensor *gate_inp;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffe38;
  ggml_tensor *in_stack_fffffffffffffe40;
  ggml_tensor *in_stack_fffffffffffffe48;
  ggml_backend_buffer *n_expert_used;
  llm_ffn_op_type lVar18;
  ggml_tensor *in_stack_fffffffffffffe58;
  llm_graph_context *in_stack_fffffffffffffe60;
  llama_expert_gating_func_type gating_op;
  float kq_scale;
  ggml_tensor *in_stack_ffffffffffffff50;
  ggml_tensor *in_stack_ffffffffffffff58;
  ggml_tensor *in_stack_ffffffffffffff60;
  ggml_tensor *in_stack_ffffffffffffff68;
  ggml_tensor *local_88;
  ggml_tensor *local_80;
  ggml_tensor *local_70;
  int local_64;
  ggml_tensor *local_40;
  ggml_tensor *local_38;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffd60,
             (llm_graph_params *)in_stack_fffffffffffffd58);
  local_40 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  pgVar2 = llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffdb0);
  pgVar10 = pgVar2;
  gf_00 = llm_graph_context::build_attn_inp_kv_unified
                    ((llm_graph_context *)in_stack_fffffffffffffdf0);
  for (local_64 = 0; (long)local_64 < in_RDI->n_layer; local_64 = local_64 + 1) {
    local_70 = local_40;
    pgVar14 = local_40;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar3 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                        in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                        (int)in_stack_fffffffffffffd50);
    uVar16 = (undefined4)((ulong)in_stack_fffffffffffffd68 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               (char *)in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    pgVar4 = std::function<ggml_tensor_*(unsigned_int,_int)>::operator()
                       ((function<ggml_tensor_*(unsigned_int,_int)> *)in_stack_fffffffffffffd50,
                        (uint)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                        (ggml_type)in_stack_fffffffffffffd48);
    iVar12 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    pgVar17 = pgVar4;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    local_80 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                          in_stack_fffffffffffffda0);
    pgVar6 = local_80;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               (char *)in_stack_fffffffffffffd50,iVar12);
    kq_scale = (float)((ulong)pgVar6 >> 0x20);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    if (pvVar5->bq != (ggml_tensor *)0x0) {
      pgVar1 = in_RDI->ctx0;
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_64);
      local_80 = (ggml_tensor *)ggml_add(pgVar1,local_80,pvVar5->bq);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                 (char *)in_stack_fffffffffffffd50,iVar12);
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    local_88 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                          in_stack_fffffffffffffda0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               (char *)in_stack_fffffffffffffd50,iVar12);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    if (pvVar5->bk != (ggml_tensor *)0x0) {
      pgVar1 = in_RDI->ctx0;
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_64);
      local_88 = (ggml_tensor *)ggml_add(pgVar1,local_88,pvVar5->bk);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                 (char *)in_stack_fffffffffffffd50,iVar12);
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar6 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                        in_stack_fffffffffffffda0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               (char *)in_stack_fffffffffffffd50,iVar12);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    if (pvVar5->bv != (ggml_tensor *)0x0) {
      pgVar1 = in_RDI->ctx0;
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_64);
      pgVar6 = (ggml_tensor *)ggml_add(pgVar1,pgVar6,pvVar5->bv);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                 (char *)in_stack_fffffffffffffd50,iVar12);
    }
    uVar7 = ggml_reshape_3d(in_RDI->ctx0,local_80,in_RDI->n_rot,in_RDI->n_head,
                            (long)in_RDI->n_tokens);
    uVar8 = ggml_reshape_3d(in_RDI->ctx0,local_88,in_RDI->n_rot,in_RDI->n_head_kv,
                            (long)in_RDI->n_tokens);
    name = (ggml_backend_buffer *)
           ggml_reshape_3d(in_RDI->ctx0,pgVar6,in_RDI->n_rot,in_RDI->n_head_kv,
                           (long)in_RDI->n_tokens);
    ggml_rope_ext(in_RDI->freq_base,in_RDI->freq_scale,in_RDI->ext_factor,in_RDI->attn_factor,
                  in_RDI->beta_fast,in_RDI->beta_slow,in_RDI->ctx0,uVar7,pgVar2,pgVar4,
                  (int)in_RDI->n_rot,in_RDI->rope_type);
    uVar8 = ggml_rope_ext(in_RDI->freq_base,in_RDI->freq_scale,in_RDI->ext_factor,
                          in_RDI->attn_factor,in_RDI->beta_fast,in_RDI->beta_slow,in_RDI->ctx0,uVar8
                          ,pgVar2,pgVar4,(int)in_RDI->n_rot,in_RDI->rope_type);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               (char *)in_stack_fffffffffffffd50,iVar12);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               (char *)in_stack_fffffffffffffd50,iVar12);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               (char *)in_stack_fffffffffffffd50,iVar12);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    gating_op = (llama_expert_gating_func_type)pvVar5->wo;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    iVar12 = (int)pvVar5->bo;
    pgVar13 = name;
    sqrtf((float)in_RDI->n_rot);
    pgVar15 = (ggml_tensor *)CONCAT44(uVar16,local_64);
    pgVar4 = (ggml_tensor *)0x0;
    pgVar6 = (ggml_tensor *)0x0;
    n_expert_used = name;
    uVar7 = uVar8;
    local_38 = llm_graph_context::build_attn
                         (in_RDI,(llm_graph_input_attn_kv_unified *)pgVar10,(ggml_cgraph *)gf_00,
                          pgVar3,pgVar14,pgVar17,in_stack_ffffffffffffff50,in_stack_ffffffffffffff58
                          ,in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,kq_scale,(int)pgVar13
                         );
    lVar18 = (llm_ffn_op_type)uVar7;
    iVar11 = SUB84(uVar8,4);
    if ((long)local_64 == in_RDI->n_layer + -1) {
      in_stack_fffffffffffffe48 =
           llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffda0);
      in_stack_ffffffffffffff68 = in_stack_fffffffffffffe48;
      local_38 = (ggml_tensor *)ggml_get_rows(in_RDI->ctx0,local_38,in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe40 = local_38;
      in_stack_fffffffffffffe38 =
           (ggml_tensor *)ggml_get_rows(in_RDI->ctx0,local_40,in_stack_ffffffffffffff68);
      local_70 = in_stack_fffffffffffffe38;
    }
    pgVar3 = (ggml_tensor *)ggml_add(in_RDI->ctx0,local_38,local_70);
    gate_inp = pgVar3;
    llm_graph_context::cb((llm_graph_context *)pgVar4,pgVar6,(char *)name,iVar11);
    in_stack_ffffffffffffff60 = gate_inp;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    gate = llm_graph_context::build_norm
                     (in_stack_fffffffffffffd70,pgVar15,pgVar4,pgVar6,
                      (llm_norm_type)((ulong)name >> 0x20),(int)name);
    cur_00 = gate;
    llm_graph_context::cb((llm_graph_context *)pgVar4,pgVar6,(char *)name,iVar11);
    pgVar15 = gate;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    pgVar6 = pvVar5->ffn_up_exps;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    pgVar17 = pvVar5->ffn_gate_exps;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar13 = (ggml_backend_buffer *)in_RDI->n_expert;
    pgVar14 = (ggml_tensor *)in_RDI->n_expert_used;
    this_00 = (llm_graph_context *)((ulong)pgVar4 & 0xffffffff00000000);
    iVar11 = 0;
    pgVar4 = (ggml_tensor *)&stack0xfffffffffffffd48;
    in_stack_fffffffffffffe18 =
         llm_graph_context::build_moe_ffn
                   ((llm_graph_context *)pgVar3,cur_00,gate_inp,in_stack_fffffffffffffe18,
                    (ggml_tensor *)&stack0xfffffffffffffd48,pgVar17,in_stack_fffffffffffffe40,
                    (int64_t)in_stack_fffffffffffffe48,(int64_t)n_expert_used,lVar18,
                    SUB81((ulong)pgVar6 >> 0x38,0),SUB81((ulong)pgVar6 >> 0x30,0),SUB84(pgVar6,0),
                    gating_op,iVar12);
    lVar18 = (llm_ffn_op_type)pgVar3;
    in_stack_ffffffffffffff58 = in_stack_fffffffffffffe18;
    llm_graph_context::cb(this_00,pgVar14,(char *)pgVar13,iVar11);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    pgVar14 = pvVar5->ffn_up_shexp;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    pgVar3 = pvVar5->ffn_gate_shexp;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    in_stack_fffffffffffffd58 = pvVar5->ffn_down_shexp;
    in_stack_fffffffffffffd70 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffd68 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffd60 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffd50 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffd48 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffde8 =
         llm_graph_context::build_ffn
                   ((llm_graph_context *)pgVar15,in_stack_fffffffffffffde8,
                    (ggml_tensor *)&stack0xfffffffffffffd48,pgVar3,pgVar14,gate,pgVar6,pgVar17,
                    pgVar4,in_stack_fffffffffffffe18,gate_inp,cur_00,lVar18,
                    (llm_ffn_gate_type)in_stack_fffffffffffffe38,(int)in_stack_fffffffffffffe40);
    in_stack_ffffffffffffff50 = in_stack_fffffffffffffde8;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               (char *)in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    uVar7 = ggml_add(in_RDI->ctx0,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               (char *)in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    ggml_add(in_RDI->ctx0,uVar7,in_stack_ffffffffffffff60);
    local_40 = llm_graph_context::build_cvec(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,0);
    in_stack_fffffffffffffdb0 = local_40;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               (char *)in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
  }
  pgVar2 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                      in_stack_fffffffffffffd58,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                      (int)in_stack_fffffffffffffd50);
  iVar12 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  pgVar10 = pgVar2;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (char *)in_stack_fffffffffffffd50,iVar12);
  plVar9 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                     ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                      0x50325f);
  plVar9->t_embd = pgVar2;
  pgVar10 = llm_graph_context::build_lora_mm
                      ((llm_graph_context *)in_stack_fffffffffffffdb0,pgVar10,
                       in_stack_fffffffffffffda0);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (char *)in_stack_fffffffffffffd50,iVar12);
  plVar9 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                     ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                      0x5032e4);
  plVar9->t_logits = pgVar10;
  ggml_build_forward_expand(in_RCX,pgVar10);
  return;
}

Assistant:

llm_build_bailingmoe(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // rope freq factors for llama3; may return nullptr for llama2 and other models
                ggml_tensor * rope_factors = static_cast<const llama_kv_cache_unified *>(memory)->cbs.get_rope_factors(n_ctx_per_seq, il);

                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_rot, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_rot, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_rot, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, rope_factors,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, rope_factors,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_rot)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            ggml_tensor * moe_out =
                build_moe_ffn(cur,
                        model.layers[il].ffn_gate_inp,
                        model.layers[il].ffn_up_exps,
                        model.layers[il].ffn_gate_exps,
                        model.layers[il].ffn_down_exps,
                        nullptr,
                        n_expert, n_expert_used,
                        LLM_FFN_SILU, hparams.expert_weights_norm,
                        false, hparams.expert_weights_scale,
                        LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,
                        il);
            cb(moe_out, "ffn_moe_out", il);

            // FFN shared expert
            {
                ggml_tensor * ffn_shexp = build_ffn(cur,
                        model.layers[il].ffn_up_shexp,   NULL, NULL,
                        model.layers[il].ffn_gate_shexp, NULL, NULL,
                        model.layers[il].ffn_down_shexp, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(ffn_shexp, "ffn_shexp", il);

                cur = ggml_add(ctx0, moe_out, ffn_shexp);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }